

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdtls.cpp
# Opt level: O1

void QDtls::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  offset_in_QDtls_to_subr *candidate;
  undefined4 uVar2;
  void **ppvVar3;
  int iVar4;
  long in_FS_OFFSET;
  undefined8 local_30;
  void *local_28;
  undefined8 *puStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == IndexOfMethod) {
    plVar1 = (long *)_a[1];
    if ((((code *)*plVar1 == pskRequired) && (uVar2 = 0, plVar1[1] == 0)) ||
       (((code *)*plVar1 == handshakeTimeout && (uVar2 = 1, plVar1[1] == 0)))) {
      *(undefined4 *)*_a = uVar2;
    }
  }
  else if (_c == InvokeMetaMethod) {
    if (_id == 1) {
      iVar4 = 1;
      ppvVar3 = (void **)0x0;
    }
    else {
      if (_id != 0) goto LAB_0025b831;
      local_30 = *_a[1];
      puStack_20 = &local_30;
      ppvVar3 = &local_28;
      local_28 = (void *)0x0;
      iVar4 = 0;
    }
    QMetaObject::activate(_o,&staticMetaObject,iVar4,ppvVar3);
  }
LAB_0025b831:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDtls::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDtls *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->pskRequired((*reinterpret_cast< std::add_pointer_t<QSslPreSharedKeyAuthenticator*>>(_a[1]))); break;
        case 1: _t->handshakeTimeout(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QDtls::*)(QSslPreSharedKeyAuthenticator * )>(_a, &QDtls::pskRequired, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDtls::*)()>(_a, &QDtls::handshakeTimeout, 1))
            return;
    }
}